

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

int djgp__count(djg_program *program)

{
  int local_1c;
  djg_program *pdStack_18;
  int i;
  djg_program *it;
  djg_program *program_local;
  
  local_1c = 0;
  for (pdStack_18 = program; pdStack_18->next != (djg_program *)0x0; pdStack_18 = pdStack_18->next)
  {
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int djgp__count(const djg_program *program)
{
    const djg_program *it = program;
    int i = 0;

    while (it->next) {
        it = it->next;
        ++i;
    }

    return i;
}